

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O2

bool __thiscall
Calc::CalcParser::Reduce
          (CalcParser *this,Parse<SGParser::ParseStackGenericElement> *parse,uint productionID)

{
  ParseStackGenericElement *pPVar1;
  
  switch(productionID) {
  case 6:
    pPVar1 = SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    translateNumber(this,(pPVar1->Str)._M_dataplus._M_p);
    break;
  case 7:
    pPVar1 = SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    translateIdentifier(this,(pPVar1->Str)._M_dataplus._M_p);
    break;
  case 8:
    translateUnaryOperation(this,Negation);
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    translateBinaryOperation(this,productionID);
    break;
  case 0xf:
  case 0x10:
    pPVar1 = SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    translateAssignment(this,(pPVar1->Str)._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Reduce(Parse<ParseStackGenericElement>& parse, unsigned productionID) override {
        switch (static_cast<ProductionEnum>(productionID)) {
            case ProductionEnum::Number:
                translateNumber(parse[0].Str.data());
                break;
            case ProductionEnum::Addition:
            case ProductionEnum::Substruction:
            case ProductionEnum::Multiplication:
            case ProductionEnum::Division:
            case ProductionEnum::Exponentiation:
                translateBinaryOperation(static_cast<ProductionEnum>(productionID));
                break;
            case ProductionEnum::Negation:
                translateUnaryOperation(static_cast<ProductionEnum>(productionID));
                break;
            case ProductionEnum::Assignment:
            case ProductionEnum::Replication:
                translateAssignment(parse[0].Str.data());
                break;
            case ProductionEnum::Identifier:
                translateIdentifier(parse[0].Str.data());
                break;
            default:
                break;
        }
        return true;
    }